

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereAddExplainText
               (Parse *pParse,int addr,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  sqlite3 *db;
  WhereLoop *pWVar5;
  Index *pIVar6;
  uint uVar7;
  Parse *pPVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  char *zFormat;
  uint bAnd;
  Op *pOVar13;
  long in_FS_OFFSET;
  bool bVar14;
  char zBuf [100];
  undefined1 local_c8 [24];
  undefined1 *local_b0;
  char local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar8 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar8 = pParse;
  }
  if (pPVar8->explain != '\x02') goto LAB_0019eec7;
  if (pParse->pVdbe->db->mallocFailed == '\0') {
    pOVar13 = pParse->pVdbe->aOp + addr;
  }
  else {
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  bVar1 = pLevel->iFrom;
  db = pParse->db;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8[0x50] = -0x56;
  local_a8[0x51] = -0x56;
  local_a8[0x52] = -0x56;
  local_a8[0x53] = -0x56;
  local_a8[0x54] = -0x56;
  local_a8[0x55] = -0x56;
  local_a8[0x56] = -0x56;
  local_a8[0x57] = -0x56;
  local_a8[0x58] = -0x56;
  local_a8[0x59] = -0x56;
  local_a8[0x5a] = -0x56;
  local_a8[0x5b] = -0x56;
  local_a8[0x5c] = -0x56;
  local_a8[0x5d] = -0x56;
  local_a8[0x5e] = -0x56;
  local_a8[0x5f] = -0x56;
  local_a8[0x40] = -0x56;
  local_a8[0x41] = -0x56;
  local_a8[0x42] = -0x56;
  local_a8[0x43] = -0x56;
  local_a8[0x44] = -0x56;
  local_a8[0x45] = -0x56;
  local_a8[0x46] = -0x56;
  local_a8[0x47] = -0x56;
  local_a8[0x48] = -0x56;
  local_a8[0x49] = -0x56;
  local_a8[0x4a] = -0x56;
  local_a8[0x4b] = -0x56;
  local_a8[0x4c] = -0x56;
  local_a8[0x4d] = -0x56;
  local_a8[0x4e] = -0x56;
  local_a8[0x4f] = -0x56;
  local_a8[0x30] = -0x56;
  local_a8[0x31] = -0x56;
  local_a8[0x32] = -0x56;
  local_a8[0x33] = -0x56;
  local_a8[0x34] = -0x56;
  local_a8[0x35] = -0x56;
  local_a8[0x36] = -0x56;
  local_a8[0x37] = -0x56;
  local_a8[0x38] = -0x56;
  local_a8[0x39] = -0x56;
  local_a8[0x3a] = -0x56;
  local_a8[0x3b] = -0x56;
  local_a8[0x3c] = -0x56;
  local_a8[0x3d] = -0x56;
  local_a8[0x3e] = -0x56;
  local_a8[0x3f] = -0x56;
  local_a8[0x20] = -0x56;
  local_a8[0x21] = -0x56;
  local_a8[0x22] = -0x56;
  local_a8[0x23] = -0x56;
  local_a8[0x24] = -0x56;
  local_a8[0x25] = -0x56;
  local_a8[0x26] = -0x56;
  local_a8[0x27] = -0x56;
  local_a8[0x28] = -0x56;
  local_a8[0x29] = -0x56;
  local_a8[0x2a] = -0x56;
  local_a8[0x2b] = -0x56;
  local_a8[0x2c] = -0x56;
  local_a8[0x2d] = -0x56;
  local_a8[0x2e] = -0x56;
  local_a8[0x2f] = -0x56;
  local_a8[0x10] = -0x56;
  local_a8[0x11] = -0x56;
  local_a8[0x12] = -0x56;
  local_a8[0x13] = -0x56;
  local_a8[0x14] = -0x56;
  local_a8[0x15] = -0x56;
  local_a8[0x16] = -0x56;
  local_a8[0x17] = -0x56;
  local_a8[0x18] = -0x56;
  local_a8[0x19] = -0x56;
  local_a8[0x1a] = -0x56;
  local_a8[0x1b] = -0x56;
  local_a8[0x1c] = -0x56;
  local_a8[0x1d] = -0x56;
  local_a8[0x1e] = -0x56;
  local_a8[0x1f] = -0x56;
  local_a8[0] = -0x56;
  local_a8[1] = -0x56;
  local_a8[2] = -0x56;
  local_a8[3] = -0x56;
  local_a8[4] = -0x56;
  local_a8[5] = -0x56;
  local_a8[6] = -0x56;
  local_a8[7] = -0x56;
  local_a8[8] = -0x56;
  local_a8[9] = -0x56;
  local_a8[10] = -0x56;
  local_a8[0xb] = -0x56;
  local_a8[0xc] = -0x56;
  local_a8[0xd] = -0x56;
  local_a8[0xe] = -0x56;
  local_a8[0xf] = -0x56;
  local_a8[0x60] = -0x56;
  local_a8[0x61] = -0x56;
  local_a8[0x62] = -0x56;
  local_a8[99] = -0x56;
  if (db->mallocFailed != '\0') goto LAB_0019eec7;
  pWVar5 = pLevel->pWLoop;
  uVar12 = pWVar5->wsFlags;
  bVar14 = true;
  if (((uVar12 & 0x30) == 0) && (((uVar12 >> 10 & 1) != 0 || ((pWVar5->u).btree.nEq == 0)))) {
    bVar14 = (wctrlFlags & 3) != 0;
  }
  local_c8._8_8_ = local_a8;
  local_c8._16_4_ = 100;
  local_c8._20_4_ = 1000000000;
  local_b0 = (undefined1 *)0xaaaa010000000000;
  pcVar10 = "SCAN";
  if (bVar14) {
    pcVar10 = "SEARCH";
  }
  local_c8._0_8_ = db;
  sqlite3_str_appendf((StrAccum *)local_c8,"%s %S",pcVar10,pTabList->a + bVar1);
  if ((uVar12 & 0x500) == 0) {
    pIVar6 = (pWVar5->u).btree.pIndex;
    if ((((pTabList->a[bVar1].pSTab)->tabFlags & 0x80) == 0) ||
       ((*(ushort *)&pIVar6->field_0x63 & 3) != 2)) {
      if ((uVar12 >> 0x11 & 1) == 0) {
        if ((uVar12 >> 0xe & 1) == 0) {
          pcVar10 = "COVERING INDEX %s";
          if ((uVar12 & 0x4000040) == 0) {
            pcVar10 = "INDEX %s";
          }
        }
        else {
          pcVar10 = "AUTOMATIC COVERING INDEX";
        }
      }
      else {
        pcVar10 = "AUTOMATIC PARTIAL COVERING INDEX";
      }
    }
    else {
      if (!bVar14) goto LAB_0019ee80;
      pcVar10 = "PRIMARY KEY";
    }
    uVar11 = (ulong)local_b0 & 0xffffffff;
    if ((u32)local_b0 + 7 < (uint)local_c8._16_4_) {
      local_b0 = (undefined1 *)CONCAT44(local_b0._4_4_,(u32)local_b0 + 7);
      builtin_strncpy((char *)(local_c8._8_8_ + uVar11)," USING ",7);
    }
    else {
      enlargeAndAppend((StrAccum *)local_c8," USING ",7);
    }
    sqlite3_str_appendf((StrAccum *)local_c8,pcVar10,pIVar6->zName);
    pIVar6 = (pWVar5->u).btree.pIndex;
    uVar2 = (pWVar5->u).btree.nEq;
    uVar3 = pWVar5->nSkip;
    if ((uVar2 != 0) || ((pWVar5->wsFlags & 0x30) != 0)) {
      uVar11 = (ulong)local_b0 & 0xffffffff;
      if ((u32)local_b0 + 2 < (uint)local_c8._16_4_) {
        local_b0 = (undefined1 *)CONCAT44(local_b0._4_4_,(u32)local_b0 + 2);
        ((char *)(local_c8._8_8_ + uVar11))[0] = ' ';
        ((char *)(local_c8._8_8_ + uVar11))[1] = '(';
      }
      else {
        enlargeAndAppend((StrAccum *)local_c8," (",2);
      }
      uVar12 = (uint)uVar2;
      if (uVar12 != 0) {
        uVar11 = 0;
        do {
          sVar4 = pIVar6->aiColumn[uVar11];
          pcVar10 = "<expr>";
          if (sVar4 != -2) {
            if (sVar4 == -1) {
              pcVar10 = "rowid";
            }
            else {
              pcVar10 = pIVar6->pTable->aCol[sVar4].zCnName;
            }
          }
          if (uVar11 != 0) {
            uVar9 = (ulong)local_b0 & 0xffffffff;
            if ((u32)local_b0 + 5 < (uint)local_c8._16_4_) {
              local_b0 = (undefined1 *)CONCAT44(local_b0._4_4_,(u32)local_b0 + 5);
              builtin_strncpy((char *)(local_c8._8_8_ + uVar9)," AND ",5);
            }
            else {
              enlargeAndAppend((StrAccum *)local_c8," AND ",5);
            }
          }
          zFormat = "%s=?";
          if (uVar11 < uVar3) {
            zFormat = "ANY(%s)";
          }
          sqlite3_str_appendf((StrAccum *)local_c8,zFormat,pcVar10);
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      uVar7 = pWVar5->wsFlags;
      bAnd = uVar12;
      if ((uVar7 & 0x20) != 0) {
        explainAppendTerm((StrAccum *)local_c8,pIVar6,(uint)(pWVar5->u).btree.nBtm,uVar12,uVar12,">"
                         );
        uVar7 = pWVar5->wsFlags;
        bAnd = 1;
      }
      if ((uVar7 & 0x10) != 0) {
        explainAppendTerm((StrAccum *)local_c8,pIVar6,(uint)(pWVar5->u).btree.nTop,uVar12,bAnd,"<");
      }
      uVar11 = (ulong)local_b0 & 0xffffffff;
      if ((u32)local_b0 + 1 < (uint)local_c8._16_4_) {
        local_b0 = (undefined1 *)CONCAT44(local_b0._4_4_,(u32)local_b0 + 1);
        *(char *)(local_c8._8_8_ + uVar11) = ')';
      }
      else {
        enlargeAndAppend((StrAccum *)local_c8,")",1);
      }
    }
  }
  else if ((uVar12 & 0xf) == 0 || (uVar12 >> 8 & 1) == 0) {
    if ((uVar12 >> 10 & 1) != 0) {
      sqlite3_str_append((sqlite3_str *)local_c8," VIRTUAL TABLE INDEX ",0x15);
      pcVar10 = "0x%x:%s";
      if ((undefined1  [24])((undefined1  [24])pWVar5->u & (undefined1  [24])0x400000000) ==
          (undefined1  [24])0x0) {
        pcVar10 = "%d:%s";
      }
      sqlite3_str_appendf((sqlite3_str *)local_c8,pcVar10,(ulong)(uint)(pWVar5->u).vtab.idxNum,
                          (pWVar5->u).btree.pIndex);
    }
  }
  else {
    sqlite3_str_appendf((StrAccum *)local_c8," USING INTEGER PRIMARY KEY (%s","rowid");
    uVar11 = 0x3d;
    if ((uVar12 & 5) == 0) {
      if ((uVar12 & 0x30) == 0x30) {
        sqlite3_str_appendf((StrAccum *)local_c8,">? AND %s","rowid");
        uVar11 = 0x3c;
      }
      else {
        uVar11 = (ulong)((uVar12 & 0x20) >> 4 | 0x3c);
      }
    }
    sqlite3_str_appendf((StrAccum *)local_c8,"%c?)",uVar11);
  }
LAB_0019ee80:
  if ((pTabList->a[bVar1].fg.jointype & 8) != 0) {
    sqlite3_str_appendf((StrAccum *)local_c8," LEFT-JOIN");
  }
  if ((pOVar13->p4).p != (void *)0x0) {
    sqlite3DbFreeNN(db,(pOVar13->p4).p);
  }
  pOVar13->p4type = -6;
  pcVar10 = sqlite3StrAccumFinish((StrAccum *)local_c8);
  (pOVar13->p4).z = pcVar10;
LAB_0019eec7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereAddExplainText(
  Parse *pParse,                  /* Parse context */
  int addr,                       /* Address of OP_Explain opcode */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
#if !defined(SQLITE_DEBUG)
  if( sqlite3ParseToplevel(pParse)->explain==2 || IS_STMT_SCANSTATUS(pParse->db) )
#endif
  {
    VdbeOp *pOp = sqlite3VdbeGetOp(pParse->pVdbe, addr);

    SrcItem *pItem = &pTabList->a[pLevel->iFrom];
    sqlite3 *db = pParse->db;     /* Database handle */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */
    WhereLoop *pLoop;             /* The controlling WhereLoop object */
    u32 flags;                    /* Flags that describe this loop */
#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_EXPLAIN)
    char *zMsg;                   /* Text to add to EQP output */
#endif
    StrAccum str;                 /* EQP output string */
    char zBuf[100];               /* Initial space for EQP output string */

    if( db->mallocFailed ) return;

    pLoop = pLevel->pWLoop;
    flags = pLoop->wsFlags;

    isSearch = (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
            || ((flags&WHERE_VIRTUALTABLE)==0 && (pLoop->u.btree.nEq>0))
            || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
    str.printfFlags = SQLITE_PRINTF_INTERNAL;
    sqlite3_str_appendf(&str, "%s %S", isSearch ? "SEARCH" : "SCAN", pItem);
    if( (flags & (WHERE_IPK|WHERE_VIRTUALTABLE))==0 ){
      const char *zFmt = 0;
      Index *pIdx;

      assert( pLoop->u.btree.pIndex!=0 );
      pIdx = pLoop->u.btree.pIndex;
      assert( !(flags&WHERE_AUTO_INDEX) || (flags&WHERE_IDX_ONLY) );
      if( !HasRowid(pItem->pSTab) && IsPrimaryKeyIndex(pIdx) ){
        if( isSearch ){
          zFmt = "PRIMARY KEY";
        }
      }else if( flags & WHERE_PARTIALIDX ){
        zFmt = "AUTOMATIC PARTIAL COVERING INDEX";
      }else if( flags & WHERE_AUTO_INDEX ){
        zFmt = "AUTOMATIC COVERING INDEX";
      }else if( flags & (WHERE_IDX_ONLY|WHERE_EXPRIDX) ){
        zFmt = "COVERING INDEX %s";
      }else{
        zFmt = "INDEX %s";
      }
      if( zFmt ){
        sqlite3_str_append(&str, " USING ", 7);
        sqlite3_str_appendf(&str, zFmt, pIdx->zName);
        explainIndexRange(&str, pLoop);
      }
    }else if( (flags & WHERE_IPK)!=0 && (flags & WHERE_CONSTRAINT)!=0 ){
      char cRangeOp;
#if 0  /* Better output, but breaks many tests */
      const Table *pTab = pItem->pTab;
      const char *zRowid = pTab->iPKey>=0 ? pTab->aCol[pTab->iPKey].zCnName:
                              "rowid";
#else
      const char *zRowid = "rowid";
#endif
      sqlite3_str_appendf(&str, " USING INTEGER PRIMARY KEY (%s", zRowid);
      if( flags&(WHERE_COLUMN_EQ|WHERE_COLUMN_IN) ){
        cRangeOp = '=';
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        sqlite3_str_appendf(&str, ">? AND %s", zRowid);
        cRangeOp = '<';
      }else if( flags&WHERE_BTM_LIMIT ){
        cRangeOp = '>';
      }else{
        assert( flags&WHERE_TOP_LIMIT);
        cRangeOp = '<';
      }
      sqlite3_str_appendf(&str, "%c?)", cRangeOp);
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_str_appendall(&str, " VIRTUAL TABLE INDEX ");
      sqlite3_str_appendf(&str,
                  pLoop->u.vtab.bIdxNumHex ? "0x%x:%s" : "%d:%s",
                  pLoop->u.vtab.idxNum, pLoop->u.vtab.idxStr);
    }
#endif
    if( pItem->fg.jointype & JT_LEFT ){
      sqlite3_str_appendf(&str, " LEFT-JOIN");
    }
#ifdef SQLITE_EXPLAIN_ESTIMATED_ROWS
    if( pLoop->nOut>=10 ){
      sqlite3_str_appendf(&str, " (~%llu rows)",
             sqlite3LogEstToInt(pLoop->nOut));
    }else{
      sqlite3_str_append(&str, " (~1 row)", 9);
    }
#endif
#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_EXPLAIN)
    zMsg = sqlite3StrAccumFinish(&str);
    sqlite3ExplainBreakpoint("",zMsg);
#endif

    assert( pOp->opcode==OP_Explain );
    assert( pOp->p4type==P4_DYNAMIC || pOp->p4.z==0 );
    sqlite3DbFree(db, pOp->p4.z);
    pOp->p4type = P4_DYNAMIC;
    pOp->p4.z = sqlite3StrAccumFinish(&str);
  }
}